

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirSample::WeightedMerge(ReservoirSample *this,ReservoirSample *other_sample)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_01;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_02;
  double dVar1;
  value_type vVar2;
  idx_t iVar3;
  idx_t iVar4;
  pointer pBVar5;
  BaseReservoirSampling *this_03;
  idx_t iVar6;
  pointer pRVar7;
  reference pvVar8;
  DataChunk *this_;
  DataChunk *other;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  pair<double,_unsigned_long> other_top;
  SelectionVector sel_other;
  vector<unsigned_long,_true> this_indexes_to_replace;
  pair<double,_unsigned_long> local_70;
  pair<double,_unsigned_long> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  iVar3 = GetActiveSampleCount(this);
  iVar4 = GetActiveSampleCount(other_sample);
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  iVar6 = pBVar5->num_entries_seen_total;
  this_01 = &(other_sample->super_BlockingSample).base_reservoir_sample;
  pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_01);
  uVar10 = iVar6 + pBVar5->num_entries_seen_total;
  if (this->sample_count < uVar10) {
    uVar10 = this->sample_count;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar11 = 0;
  if (uVar10 <= iVar4 + iVar3) {
    lVar11 = (iVar4 + iVar3) - uVar10;
  }
  while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
    pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    dVar1 = pBVar5->min_weight_threshold;
    pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_01);
    if (dVar1 < pBVar5->min_weight_threshold || dVar1 == pBVar5->min_weight_threshold) {
      local_60 = BlockingSample::PopFromWeightQueue(&this->super_BlockingSample);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&local_60.second
                );
      this_03 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                ::operator->(this_00);
    }
    else {
      pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_01);
      ::std::
      priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
      ::pop(&pBVar5->reservoir_weights);
      this_03 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                ::operator->(this_01);
    }
    BaseReservoirSampling::UpdateMinWeightThreshold(this_03);
  }
  iVar6 = BlockingSample::GetPriorityQueueSize(&other_sample->super_BlockingSample);
  SelectionVector::SelectionVector((SelectionVector *)&local_60,iVar6);
  this_02 = &this->reservoir_chunk;
  uVar10 = 0;
  while( true ) {
    iVar6 = BlockingSample::GetPriorityQueueSize(&other_sample->super_BlockingSample);
    if (iVar6 == 0) break;
    local_70 = BlockingSample::PopFromWeightQueue(&other_sample->super_BlockingSample);
    pRVar7 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_02);
    iVar6 = (pRVar7->chunk).count;
    *(sel_t *)((long)local_60.first + uVar10 * 4) = (sel_t)local_70.second;
    iVar9 = (int)iVar6;
    if (uVar10 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar8 = vector<unsigned_long,_true>::get<true>
                         ((vector<unsigned_long,_true> *)&local_48,uVar10);
      vVar2 = *pvVar8;
      (this->sel).sel_vector[vVar2] = iVar9 + (int)uVar10;
      local_70.second = vVar2;
    }
    else {
      iVar6 = this->sel_size;
      (this->sel).sel_vector[iVar6] = iVar9 + (int)uVar10;
      local_70.second = iVar6;
      this->sel_size = iVar6 + 1;
    }
    pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::push(&pBVar5->reservoir_weights,&local_70);
    uVar10 = uVar10 + 1;
  }
  pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  BaseReservoirSampling::UpdateMinWeightThreshold(pBVar5);
  iVar6 = GetTuplesSeen(this);
  iVar3 = GetTuplesSeen(other_sample);
  pBVar5 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  pBVar5->num_entries_seen_total = iVar3 + iVar6;
  this_ = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(this_02)->chunk;
  other = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(&other_sample->reservoir_chunk)->chunk;
  UpdateSampleAppend(this,this_,other,(SelectionVector *)&local_60,uVar10);
  pRVar7 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(this_02);
  if (0x3800 < (pRVar7->chunk).count) {
    Vacuum(this);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void ReservoirSample::WeightedMerge(ReservoirSample &other_sample) {
	D_ASSERT(GetSamplingState() == SamplingState::RESERVOIR);
	D_ASSERT(other_sample.GetSamplingState() == SamplingState::RESERVOIR);

	// Find out how many samples we want to keep.
	idx_t total_samples = GetActiveSampleCount() + other_sample.GetActiveSampleCount();
	idx_t total_samples_seen =
	    base_reservoir_sample->num_entries_seen_total + other_sample.base_reservoir_sample->num_entries_seen_total;
	idx_t num_samples_to_keep = MinValue<idx_t>(total_samples, MinValue<idx_t>(sample_count, total_samples_seen));

	D_ASSERT(GetActiveSampleCount() <= num_samples_to_keep);
	D_ASSERT(total_samples <= FIXED_SAMPLE_SIZE * 2);

	// pop from base base_reservoir weights until there are num_samples_to_keep left.
	vector<idx_t> this_indexes_to_replace;
	for (idx_t i = num_samples_to_keep; i < total_samples; i++) {
		auto min_weight_this = base_reservoir_sample->min_weight_threshold;
		auto min_weight_other = other_sample.base_reservoir_sample->min_weight_threshold;
		// min weight threshol is always positive
		if (min_weight_this > min_weight_other) {
			// pop from other
			other_sample.base_reservoir_sample->reservoir_weights.pop();
			other_sample.base_reservoir_sample->UpdateMinWeightThreshold();
		} else {
			auto top_this = PopFromWeightQueue();
			this_indexes_to_replace.push_back(top_this.second);
			base_reservoir_sample->UpdateMinWeightThreshold();
		}
	}

	D_ASSERT(other_sample.GetPriorityQueueSize() + GetPriorityQueueSize() <= FIXED_SAMPLE_SIZE);
	D_ASSERT(other_sample.GetPriorityQueueSize() + GetPriorityQueueSize() == num_samples_to_keep);
	D_ASSERT(other_sample.reservoir_chunk->chunk.GetTypes() == reservoir_chunk->chunk.GetTypes());

	// Prepare a selection vector to copy data from the other sample chunk to this sample chunk
	SelectionVector sel_other(other_sample.GetPriorityQueueSize());
	D_ASSERT(GetPriorityQueueSize() <= num_samples_to_keep);
	D_ASSERT(other_sample.GetPriorityQueueSize() >= this_indexes_to_replace.size());
	idx_t chunk_offset = 0;

	// Now push weights from other.base_reservoir_sample to this
	// Depending on how many sample values "this" has, we either need to add to the selection vector
	// Or replace values in "this'" selection vector
	idx_t i = 0;
	while (other_sample.GetPriorityQueueSize() > 0) {
		auto other_top = other_sample.PopFromWeightQueue();
		idx_t index_for_new_pair = chunk_offset + reservoir_chunk->chunk.size();

		// update the sel used to copy values from other to this
		sel_other.set_index(chunk_offset, other_top.second);
		if (i < this_indexes_to_replace.size()) {
			auto replacement_index = this_indexes_to_replace[i];
			sel.set_index(replacement_index, index_for_new_pair);
			other_top.second = replacement_index;
		} else {
			sel.set_index(sel_size, index_for_new_pair);
			other_top.second = sel_size;
			sel_size += 1;
		}

		// make sure that the sample indexes are (this.sample_chunk.size() + chunk_offfset)
		base_reservoir_sample->reservoir_weights.push(other_top);
		chunk_offset += 1;
		i += 1;
	}

	D_ASSERT(GetPriorityQueueSize() == num_samples_to_keep);

	base_reservoir_sample->UpdateMinWeightThreshold();
	D_ASSERT(base_reservoir_sample->min_weight_threshold > 0);
	base_reservoir_sample->num_entries_seen_total = GetTuplesSeen() + other_sample.GetTuplesSeen();

	UpdateSampleAppend(reservoir_chunk->chunk, other_sample.reservoir_chunk->chunk, sel_other, chunk_offset);
	if (reservoir_chunk->chunk.size() > FIXED_SAMPLE_SIZE * (FIXED_SAMPLE_SIZE_MULTIPLIER - 3)) {
		Vacuum();
	}

	Verify();
}